

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
create_new_data_nodes
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          data_node_type *old_node,model_node_type *parent,int fanout_tree_depth,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,int start_bucketID,int extra_duplication_factor)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  FTNode *pFVar5;
  self_type *psVar6;
  double dVar7;
  bool keep_left;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  data_node_type *pdVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  data_node_type *pdVar16;
  int left;
  int right;
  FTNode *tree_node;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 in_XMM4_Qb;
  
  iVar2 = old_node->num_right_out_of_bounds_inserts_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (parent->super_AlexNode<int,_int>).model_.a_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (parent->super_AlexNode<int,_int>).model_.b_;
  tree_node = (used_fanout_tree_nodes->
              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              )._M_impl.super__Vector_impl_data._M_start;
  iVar3 = old_node->num_inserts_;
  uVar15 = parent->num_children_ - 1;
  auVar18._0_8_ = (double)old_node->max_key_;
  auVar18._8_8_ = in_XMM4_Qb;
  auVar18 = vfmadd213sd_fma(auVar18,auVar22,auVar23);
  iVar4 = old_node->num_left_out_of_bounds_inserts_;
  uVar8 = ~((int)auVar18._0_8_ >> 0x1f) & (int)auVar18._0_8_;
  if ((int)uVar15 < (int)uVar8) {
    uVar8 = uVar15;
  }
  auVar19._0_8_ = (double)old_node->min_key_;
  auVar19._8_8_ = in_XMM4_Qb;
  auVar18 = vfmadd213sd_fma(auVar19,auVar22,auVar23);
  uVar9 = ~((int)auVar18._0_8_ >> 0x1f) & (int)auVar18._0_8_;
  if ((int)uVar9 <= (int)uVar15) {
    uVar15 = uVar9;
  }
  pFVar5 = (used_fanout_tree_nodes->
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  iVar13 = 0;
  pdVar16 = old_node->prev_leaf_;
  left = 0;
  for (; tree_node != pFVar5; tree_node = tree_node + 1) {
    uVar9 = (fanout_tree_depth - tree_node->level) + extra_duplication_factor;
    iVar17 = 1 << (uVar9 & 0x1f);
    if ((double)iVar2 / (double)iVar3 <= 0.9) {
      keep_left = false;
    }
    else {
      keep_left = false;
      if (start_bucketID <= (int)uVar8) {
        keep_left = (int)uVar8 < iVar17 + start_bucketID;
      }
    }
    iVar17 = iVar17 + start_bucketID;
    tree_node->num_keys = tree_node->num_keys - iVar13;
    iVar10 = old_node->data_capacity_;
    right = tree_node->right_boundary;
    iVar13 = 0;
    while (((right < iVar10 && (old_node->key_slots_[right] != 0x7fffffff)) &&
           (auVar20._8_8_ = 0, auVar20._0_8_ = (parent->super_AlexNode<int,_int>).model_.a_,
           auVar21._0_8_ = (double)old_node->key_slots_[right], auVar21._8_8_ = in_XMM4_Qb,
           auVar1._8_8_ = 0, auVar1._0_8_ = (parent->super_AlexNode<int,_int>).model_.b_,
           auVar18 = vfmadd213sd_fma(auVar21,auVar20,auVar1), (int)auVar18._0_8_ < iVar17))) {
      iVar13 = iVar13 + 1;
      iVar11 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               ::get_next_filled_position(old_node,right,false);
      iVar10 = old_node->data_capacity_;
      right = iVar11 + 1;
      if (iVar10 < iVar11 + 1) {
        right = iVar10;
      }
    }
    tree_node->num_keys = tree_node->num_keys + iVar13;
    pdVar12 = bulk_load_leaf_node_from_existing
                        (this,old_node,left,right,false,tree_node,false,keep_left,
                         ((int)uVar15 < iVar17 && start_bucketID <= (int)uVar15) &&
                         0.9 < (double)iVar4 / (double)iVar3);
    (pdVar12->super_AlexNode<int,_int>).level_ = (parent->super_AlexNode<int,_int>).level_ + 1;
    (pdVar12->super_AlexNode<int,_int>).cost_ = tree_node->cost;
    (pdVar12->super_AlexNode<int,_int>).duplication_factor_ = (uint8_t)uVar9;
    dVar7 = tree_node->expected_avg_shifts;
    pdVar12->expected_avg_exp_search_iterations_ = tree_node->expected_avg_search_iterations;
    pdVar12->expected_avg_shifts_ = dVar7;
    pdVar12->prev_leaf_ = pdVar16;
    if (pdVar16 != (data_node_type *)0x0) {
      pdVar16->next_leaf_ = pdVar12;
    }
    for (lVar14 = (long)start_bucketID; lVar14 < iVar17; lVar14 = lVar14 + 1) {
      parent->children_[lVar14] = &pdVar12->super_AlexNode<int,_int>;
    }
    pdVar16 = pdVar12;
    left = right;
    start_bucketID = iVar17;
  }
  psVar6 = old_node->next_leaf_;
  pdVar16->next_leaf_ = psVar6;
  if (psVar6 != (self_type *)0x0) {
    psVar6->prev_leaf_ = pdVar16;
  }
  return;
}

Assistant:

void create_new_data_nodes(
      const data_node_type* old_node, model_node_type* parent,
      int fanout_tree_depth,
      std::vector<fanout_tree::FTNode>& used_fanout_tree_nodes,
      int start_bucketID = 0, int extra_duplication_factor = 0) {
    bool append_mostly_right = old_node->is_append_mostly_right();
    int appending_right_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->max_key_), 0),
        parent->num_children_ - 1);
    bool append_mostly_left = old_node->is_append_mostly_left();
    int appending_left_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->min_key_), 0),
        parent->num_children_ - 1);

    // Create the new data nodes
    int cur = start_bucketID;  // first bucket with same child
    data_node_type* prev_leaf =
        old_node->prev_leaf_;  // used for linking the new data nodes
    int left_boundary = 0;
    int right_boundary = 0;
    // Keys may be re-assigned to an adjacent fanout tree node due to off-by-one
    // errors
    int num_reassigned_keys = 0;
    for (fanout_tree::FTNode& tree_node : used_fanout_tree_nodes) {
      left_boundary = right_boundary;
      auto duplication_factor = static_cast<uint8_t>(
          fanout_tree_depth - tree_node.level + extra_duplication_factor);
      int child_node_repeats = 1 << duplication_factor;
      bool keep_left = append_mostly_right && cur <= appending_right_bucketID &&
                       appending_right_bucketID < cur + child_node_repeats;
      bool keep_right = append_mostly_left && cur <= appending_left_bucketID &&
                        appending_left_bucketID < cur + child_node_repeats;
      right_boundary = tree_node.right_boundary;
      // Account for off-by-one errors due to floating-point precision issues.
      tree_node.num_keys -= num_reassigned_keys;
      num_reassigned_keys = 0;
      while (right_boundary < old_node->data_capacity_ &&
             old_node->get_key(right_boundary) !=
                 data_node_type::kEndSentinel_ &&
             parent->model_.predict(old_node->get_key(right_boundary)) <
                 cur + child_node_repeats) {
        num_reassigned_keys++;
        right_boundary = std::min(
            old_node->get_next_filled_position(right_boundary, false) + 1,
            old_node->data_capacity_);
      }
      tree_node.num_keys += num_reassigned_keys;
      data_node_type* child_node = bulk_load_leaf_node_from_existing(
          old_node, left_boundary, right_boundary, false, &tree_node, false,
          keep_left, keep_right);
      child_node->level_ = static_cast<short>(parent->level_ + 1);
      child_node->cost_ = tree_node.cost;
      child_node->duplication_factor_ = duplication_factor;
      child_node->expected_avg_exp_search_iterations_ =
          tree_node.expected_avg_search_iterations;
      child_node->expected_avg_shifts_ = tree_node.expected_avg_shifts;
      child_node->prev_leaf_ = prev_leaf;
      if (prev_leaf != nullptr) {
        prev_leaf->next_leaf_ = child_node;
      }
      for (int i = cur; i < cur + child_node_repeats; i++) {
        parent->children_[i] = child_node;
      }
      cur += child_node_repeats;
      prev_leaf = child_node;
    }
    prev_leaf->next_leaf_ = old_node->next_leaf_;
    if (old_node->next_leaf_ != nullptr) {
      old_node->next_leaf_->prev_leaf_ = prev_leaf;
    }
  }